

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

void close_var_refs(JSRuntime *rt,JSStackFrame *sf)

{
  JSRuntime *pJVar1;
  long in_RSI;
  JSRuntime *in_RDI;
  JSValue JVar2;
  int var_idx;
  JSVarRef *var_ref;
  list_head *el1;
  list_head *el;
  JSGCObjectHeader *in_stack_ffffffffffffff98;
  JSRuntime *in_stack_ffffffffffffffa0;
  JSValueUnion local_50;
  size_t local_48;
  JSValueUnion local_40;
  int64_t local_38;
  long local_20;
  long local_18;
  
  local_18 = *(long *)(in_RSI + 0x30);
  local_20 = *(long *)(local_18 + 8);
  while (local_18 != in_RSI + 0x28) {
    pJVar1 = (JSRuntime *)(local_18 + -8);
    if ((*(byte *)(local_18 + -3) >> 1 & 1) == 0) {
      JVar2 = JS_DupValueRT(in_RDI,*(JSValue *)
                                    (*(long *)(in_RSI + 0x20) +
                                    (long)(int)(uint)*(ushort *)(local_18 + -2) * 0x10));
      local_50 = JVar2.u;
      (pJVar1->malloc_state).malloc_count = (size_t)local_50;
      local_48 = JVar2.tag;
      (pJVar1->malloc_state).malloc_size = local_48;
      in_stack_ffffffffffffffa0 = pJVar1;
    }
    else {
      JVar2 = JS_DupValueRT(in_RDI,*(JSValue *)
                                    (*(long *)(in_RSI + 0x18) +
                                    (long)(int)(uint)*(ushort *)(local_18 + -2) * 0x10));
      local_40 = JVar2.u;
      *(JSValueUnion *)(local_18 + 0x18) = local_40;
      local_38 = JVar2.tag;
      *(int64_t *)(local_18 + 0x20) = local_38;
    }
    *(long *)(local_18 + 0x10) = local_18 + 0x18;
    *(byte *)(local_18 + -3) = *(byte *)(local_18 + -3) & 0xfe | 1;
    add_gc_object(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,JS_GC_OBJ_TYPE_JS_OBJECT);
    local_18 = local_20;
    local_20 = *(long *)(local_20 + 8);
  }
  return;
}

Assistant:

static void close_var_refs(JSRuntime *rt, JSStackFrame *sf)
{
    struct list_head *el, *el1;
    JSVarRef *var_ref;
    int var_idx;

    list_for_each_safe(el, el1, &sf->var_ref_list) {
        var_ref = list_entry(el, JSVarRef, header.link);
        var_idx = var_ref->var_idx;
        if (var_ref->is_arg)
            var_ref->value = JS_DupValueRT(rt, sf->arg_buf[var_idx]);
        else
            var_ref->value = JS_DupValueRT(rt, sf->var_buf[var_idx]);
        var_ref->pvalue = &var_ref->value;
        /* the reference is no longer to a local variable */
        var_ref->is_detached = TRUE;
        add_gc_object(rt, &var_ref->header, JS_GC_OBJ_TYPE_VAR_REF);
    }
}